

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

OutputFile * __thiscall re2c::OutputFile::wdelay_warn_condition_order(OutputFile *this)

{
  OutputBlock *this_00;
  OutputFragment *pOVar1;
  OutputFragment *local_20;
  
  this_00 = (this->blocks).
            super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  pOVar1 = (OutputFragment *)operator_new(0x188);
  pOVar1->type = WARN_CONDITION_ORDER;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pOVar1->stream);
  pOVar1->indent = 0;
  local_20 = pOVar1;
  std::vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>>::
  emplace_back<re2c::OutputFragment*>
            ((vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>> *)this_00,
             &local_20);
  insert_code(this);
  return this;
}

Assistant:

OutputFile & OutputFile::wdelay_warn_condition_order ()
{
	blocks.back ()->fragments.push_back (new OutputFragment (OutputFragment::WARN_CONDITION_ORDER, 0));
	insert_code ();
	return *this;
}